

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O1

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:661:59)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:661:59)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  bool bVar1;
  uint32_t uVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  global_object *this_00;
  object *poVar6;
  uint *puVar7;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar8;
  undefined8 extraout_RDX_02;
  pointer pvVar9;
  value *pvVar10;
  uint uVar11;
  mjs *this_01;
  gc_heap *this_02;
  long lVar12;
  initializer_list<mjs::value> __l;
  initializer_list<mjs::value> __l_00;
  object_ptr o;
  wstring is;
  value callback;
  value kval;
  value this_arg;
  value res;
  allocator_type local_1b9;
  gc_heap_ptr_untyped local_1b8;
  undefined1 local_1a8 [32];
  slot *local_188;
  gc_heap_ptr_untyped local_180;
  value local_170;
  undefined4 local_148;
  double local_140;
  slot local_120;
  gc_heap_ptr_untyped local_118 [2];
  value *local_f8;
  gc_heap *local_f0;
  value local_e8;
  vector<mjs::value,_std::allocator<mjs::value>_> local_c0;
  value local_a8;
  value local_80;
  value local_58;
  
  local_180.heap_ = (this->f).global.super_gc_heap_ptr_untyped.heap_;
  local_180.pos_ = (this->f).global.super_gc_heap_ptr_untyped.pos_;
  local_f8 = __return_storage_ptr__;
  if (local_180.heap_ != (gc_heap *)0x0) {
    gc_heap::attach(local_180.heap_,&local_180);
  }
  plVar4 = (long *)gc_heap_ptr_untyped::get(&local_180);
  (**(code **)(*plVar4 + 0x88))(&local_1b8,plVar4,this_);
  puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&local_1b8);
  local_e8.type_ = reference;
  local_e8._4_4_ = 0;
  local_e8.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
       (gc_heap *)0x194f34;
  (**(code **)*puVar5)(&local_170,puVar5);
  uVar2 = to_uint32(&local_170);
  value::destroy(&local_170);
  pvVar9 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pvVar9 == (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                super__Vector_impl_data._M_finish) {
    pvVar9 = (pointer)&value::undefined;
  }
  value::value(&local_e8,pvVar9);
  this_00 = (global_object *)gc_heap_ptr_untyped::get(&local_180);
  plVar4 = (long *)gc_heap_ptr_untyped::get(&local_180);
  (**(code **)(*plVar4 + 0x60))(&local_170,plVar4);
  global_object::validate_type(this_00,&local_e8,(object_ptr *)&local_170,"function");
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&local_170);
  pvVar9 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((ulong)(((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)pvVar9 >> 3) * -0x3333333333333333) <
      2) {
    pvVar10 = (value *)&value::undefined;
  }
  else {
    pvVar10 = pvVar9 + 1;
  }
  value::value(&local_80,pvVar10);
  if (uVar2 < 0x10000) {
    if (uVar2 != 0) {
      this_01 = (mjs *)0x0;
      uVar8 = extraout_RDX;
      do {
        index_string_abi_cxx11_((wstring *)local_1a8,this_01,(uint32_t)uVar8);
        poVar6 = (object *)gc_heap_ptr_untyped::get(&local_1b8);
        local_170._0_8_ = local_1a8._8_8_;
        local_170.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
             (gc_heap *)local_1a8._0_8_;
        bVar1 = object::has_property(poVar6,(wstring_view *)&local_170);
        uVar8 = extraout_RDX_00;
        if (bVar1) {
          puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&local_1b8);
          local_170._0_8_ = local_1a8._8_8_;
          local_170.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
               (gc_heap *)local_1a8._0_8_;
          (**(code **)*puVar5)(&local_a8,puVar5,&local_170);
          value::value(&local_170,&local_a8);
          local_140 = (double)(int)this_01;
          local_148 = 3;
          local_120.new_position = 5;
          local_118[0].heap_ = local_1b8.heap_;
          local_118[0].pos_ = local_1b8.pos_;
          if (local_1b8.heap_ != (gc_heap *)0x0) {
            gc_heap::attach(local_1b8.heap_,local_118);
          }
          __l._M_len = 3;
          __l._M_array = &local_170;
          std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(&local_c0,__l,&local_1b9);
          call_function(&local_58,&local_e8,&local_80,&local_c0);
          std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_c0);
          lVar12 = 0x50;
          do {
            value::destroy((value *)((long)&local_170.type_ + lVar12));
            lVar12 = lVar12 + -0x28;
          } while (lVar12 != -0x28);
          value::destroy(&local_58);
          value::destroy(&local_a8);
          uVar8 = extraout_RDX_01;
        }
        if ((gc_heap *)local_1a8._0_8_ != (gc_heap *)(local_1a8 + 0x10)) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ * 4 + 4);
          uVar8 = extraout_RDX_02;
        }
        uVar11 = (int)this_01 + 1;
        this_01 = (mjs *)(ulong)uVar11;
      } while (uVar11 != uVar2);
    }
  }
  else {
    poVar6 = (object *)gc_heap_ptr_untyped::get(&local_1b8);
    object::enumerable_property_names
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_1a8,poVar6);
    local_f0 = (gc_heap *)local_1a8._8_8_;
    if (local_1a8._0_8_ != local_1a8._8_8_) {
      local_188 = &local_120;
      this_02 = (gc_heap *)local_1a8._0_8_;
      do {
        puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_02);
        local_170.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
             (gc_heap *)(puVar7 + 1);
        local_170._0_8_ = ZEXT48(*puVar7);
        uVar2 = index_value_from_string((wstring_view *)&local_170);
        if (uVar2 == 0xffffffff) {
          iVar3 = 6;
        }
        else {
          puVar5 = (undefined8 *)gc_heap_ptr_untyped::get(&local_1b8);
          puVar7 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_02);
          local_170.field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
               (gc_heap *)(puVar7 + 1);
          local_170._0_8_ = ZEXT48(*puVar7);
          (**(code **)*puVar5)(&local_a8,puVar5,&local_170);
          value::value(&local_170,&local_a8);
          local_140 = (double)uVar2;
          local_148 = 3;
          local_120.new_position = 5;
          local_118[0].heap_ = local_1b8.heap_;
          local_118[0].pos_ = local_1b8.pos_;
          if (local_1b8.heap_ != (gc_heap *)0x0) {
            gc_heap::attach(local_1b8.heap_,local_118);
          }
          __l_00._M_len = 3;
          __l_00._M_array = &local_170;
          std::vector<mjs::value,_std::allocator<mjs::value>_>::vector(&local_c0,__l_00,&local_1b9);
          call_function(&local_58,&local_e8,&local_80,&local_c0);
          std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector(&local_c0);
          lVar12 = 0x50;
          do {
            value::destroy((value *)((long)&local_170.type_ + lVar12));
            lVar12 = lVar12 + -0x28;
          } while (lVar12 != -0x28);
          value::destroy(&local_58);
          value::destroy(&local_a8);
          iVar3 = 0;
        }
      } while (((iVar3 == 6) || (iVar3 == 0)) &&
              (this_02 = (gc_heap *)&this_02->alloc_context_, this_02 != local_f0));
    }
    std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)local_1a8);
  }
  value::destroy(&local_80);
  value::destroy(&local_e8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_1b8);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_180);
  pvVar10 = local_f8;
  value::value(local_f8,(value *)&value::undefined);
  return pvVar10;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }